

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManCountDupLut(Gia_Man_t *p)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pObj_00;
  uint local_3c;
  uint local_38;
  int nCountMux;
  int nCountPis;
  int nCountDup;
  int pFanins [3];
  int i;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  nCountMux = 0;
  local_38 = 0;
  local_3c = 0;
  Gia_ManCleanMark01(p);
  pFanins[1] = 1;
  do {
    iVar6 = pFanins[1];
    iVar5 = Gia_ManObjNum(p);
    if (iVar5 <= iVar6) {
      Gia_ManCleanMark01(p);
      if (nCountMux + local_38 + local_3c != 0) {
        iVar6 = Gia_ManLutNum(p);
        printf("Dup fanins = %d.  CI fanins = %d.  MUX fanins = %d.  Total = %d.  (%.2f %%)\n",
               ((double)(int)(nCountMux + local_38 + local_3c) * 100.0) / (double)iVar6,
               (ulong)(uint)nCountMux,(ulong)local_38,(ulong)local_3c,(ulong)(nCountMux + local_38))
        ;
      }
      return nCountMux + local_38;
    }
    iVar6 = Gia_ObjIsLut(p,pFanins[1]);
    if ((iVar6 != 0) && (iVar6 = Gia_ObjLutIsMux(p,pFanins[1]), iVar6 != 0)) {
      pObj_00 = Gia_ManObj(p,pFanins[1]);
      *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xbfffffffffffffff | 0x4000000000000000;
      iVar6 = Gia_ObjLutSize(p,pFanins[1]);
      if (iVar6 == 3) {
        Gia_ManPrintGetMuxFanins(p,pObj_00,&nCountPis);
        register0x00000000 = Gia_ManObj(p,nCountDup);
        iVar6 = Gia_ObjIsCi(register0x00000000);
        uVar1 = *(ulong *)stack0xffffffffffffffe0;
        uVar2 = *(ulong *)stack0xffffffffffffffe0;
        *(ulong *)stack0xffffffffffffffe0 =
             *(ulong *)stack0xffffffffffffffe0 & 0xffffffffbfffffff | 0x40000000;
        register0x00000000 = Gia_ManObj(p,pFanins[0]);
        iVar5 = Gia_ObjIsCi(register0x00000000);
        local_38 = iVar5 + iVar6 + local_38;
        nCountMux = ((uint)(*(ulong *)stack0xffffffffffffffe0 >> 0x1e) & 1) +
                    ((uint)(uVar1 >> 0x1e) & 1) + nCountMux;
        local_3c = ((uint)(*(ulong *)stack0xffffffffffffffe0 >> 0x3e) & 1) +
                   ((uint)(uVar2 >> 0x3e) & 1) + local_3c;
        *(ulong *)stack0xffffffffffffffe0 =
             *(ulong *)stack0xffffffffffffffe0 & 0xffffffffbfffffff | 0x40000000;
      }
      else {
        iVar6 = Gia_ObjLutSize(p,pFanins[1]);
        if (iVar6 != 2) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                        ,0x1bc,"int Gia_ManCountDupLut(Gia_Man_t *)");
        }
        register0x00000000 = Gia_ObjFanin0(pObj_00);
        if (((*(ulong *)register0x00000000 >> 0x1e & 1) == 0) &&
           ((*(ulong *)register0x00000000 >> 0x3e & 1) == 0)) {
          iVar6 = Gia_ObjIsCi(register0x00000000);
          uVar3 = (uint)(*(ulong *)stack0xffffffffffffffe0 >> 0x1e);
          uVar4 = (uint)(*(ulong *)stack0xffffffffffffffe0 >> 0x20);
          *(ulong *)stack0xffffffffffffffe0 =
               *(ulong *)stack0xffffffffffffffe0 & 0xffffffffbfffffff | 0x40000000;
        }
        else {
          register0x00000000 = Gia_ObjFanin1(pObj_00);
          iVar6 = Gia_ObjIsCi(register0x00000000);
          uVar3 = (uint)(*(ulong *)stack0xffffffffffffffe0 >> 0x1e);
          uVar4 = (uint)(*(ulong *)stack0xffffffffffffffe0 >> 0x20);
          *(ulong *)stack0xffffffffffffffe0 =
               *(ulong *)stack0xffffffffffffffe0 & 0xffffffffbfffffff | 0x40000000;
        }
        nCountMux = (uVar3 & 1) + nCountMux;
        local_38 = iVar6 + local_38;
        local_3c = (uVar4 >> 0x1e & 1) + local_3c;
      }
    }
    pFanins[1] = pFanins[1] + 1;
  } while( true );
}

Assistant:

int Gia_ManCountDupLut( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pFanin;
    int i, pFanins[3], nCountDup = 0, nCountPis = 0, nCountMux = 0;
    Gia_ManCleanMark01( p );
    Gia_ManForEachLut( p, i )
        if ( Gia_ObjLutIsMux(p, i) )
        {
            pObj = Gia_ManObj( p, i );
            pObj->fMark1 = 1;
            if ( Gia_ObjLutSize(p, i) == 3 )
            {
                Gia_ManPrintGetMuxFanins( p, pObj, pFanins );

                pFanin = Gia_ManObj(p, pFanins[1]);
                nCountPis += Gia_ObjIsCi(pFanin);
                nCountDup += pFanin->fMark0;
                nCountMux += pFanin->fMark1;
                pFanin->fMark0 = 1;

                pFanin = Gia_ManObj(p, pFanins[2]);
                nCountPis += Gia_ObjIsCi(pFanin);
                nCountDup += pFanin->fMark0;
                nCountMux += pFanin->fMark1;
                pFanin->fMark0 = 1;
            }
            else if ( Gia_ObjLutSize(p, i) == 2 )
            {
                pFanin = Gia_ObjFanin0(pObj);
                if ( pFanin->fMark0 || pFanin->fMark1 )
                {
                    pFanin = Gia_ObjFanin1(pObj);
                    nCountPis += Gia_ObjIsCi(pFanin);
                    nCountDup += pFanin->fMark0;
                    nCountMux += pFanin->fMark1;
                    pFanin->fMark0 = 1;
                }
                else
                {
                    nCountPis += Gia_ObjIsCi(pFanin);
                    nCountDup += pFanin->fMark0;
                    nCountMux += pFanin->fMark1;
                    pFanin->fMark0 = 1;
                }
            }
            else assert( 0 );
        }
    Gia_ManCleanMark01( p );
    if ( nCountDup + nCountPis + nCountMux )
        printf( "Dup fanins = %d.  CI fanins = %d.  MUX fanins = %d.  Total = %d.  (%.2f %%)\n", 
            nCountDup, nCountPis, nCountMux, nCountDup + nCountPis, 100.0 * (nCountDup + nCountPis + nCountMux) / Gia_ManLutNum(p) );
    return nCountDup + nCountPis;
}